

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void util_makepath(char *path)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  char *__path;
  int *piVar3;
  char *pcVar4;
  char *local_20;
  char *filename;
  char *name;
  char *path_local;
  
  if ((path != (char *)0x0) && (*path != '/')) {
    __path = strdup(path);
    local_20 = __path;
    do {
      local_20 = strchr(local_20,0x2f);
      if (local_20 == (char *)0x0) {
        free(__path);
        return;
      }
      *local_20 = '\0';
      iVar2 = mkdir(__path,0x1ff);
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        __stream = _stderr;
        pcVar1 = argv0;
        if (*piVar3 != 0x11) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(__stream,"%s: couldn\'t create directory %s: %s\n",pcVar1,__path,pcVar4);
          abort();
        }
      }
      *local_20 = '/';
      local_20 = local_20 + 1;
    } while( true );
  }
  fprintf(_stderr,"%s: invalid path: %s\n",argv0,path);
  abort();
}

Assistant:

void
util_makepath(
    const char* path)
{
    char* name;
    char* filename;

    /* TODO: Implement something like this for Windows. */
    if (!path || path[0] == '/') {
        fprintf(stderr, "%s: invalid path: %s\n", argv0, path);
        abort();
    }

    name = strdup(path);
    filename = name;

    for (;;) {
        filename = strchr(filename, '/');
        if (!filename)
            break;
        *filename = '\0';

#ifdef _WIN32
        if (CreateDirectory(name, NULL) == 0 && GetLastError() != ERROR_ALREADY_EXISTS) {
            fprintf(stderr, "%s: couldn't create directory %s\n",
                argv0, name);
            abort();
        }
#else
        if (mkdir(name, 0777) == -1
#ifdef EEXIST
            && errno != EEXIST
#endif
            ) {
            fprintf(stderr, "%s: couldn't create directory %s: %s\n",
                argv0, name, strerror(errno));
            abort();
        }
#endif

        *filename = '/';
        ++filename;
    }

    free(name);
}